

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipkincore_types.cpp
# Opt level: O0

void __thiscall twitter::zipkin::thrift::Span::Span(Span *this,Span *other19)

{
  Span *other19_local;
  Span *this_local;
  
  apache::thrift::TBase::TBase((TBase *)this);
  *(undefined ***)this = &PTR__Span_004fd6e8;
  *(undefined ***)this = &PTR__Span_004fd6e8;
  std::__cxx11::string::string((string *)&this->name);
  std::
  vector<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
  ::vector(&this->annotations);
  std::
  vector<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
  ::vector(&this->binary_annotations);
  _Span__isset::_Span__isset(&this->__isset);
  this->trace_id = other19->trace_id;
  std::__cxx11::string::operator=((string *)&this->name,(string *)&other19->name);
  this->id = other19->id;
  this->parent_id = other19->parent_id;
  std::
  vector<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
  ::operator=(&this->annotations,&other19->annotations);
  std::
  vector<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
  ::operator=(&this->binary_annotations,&other19->binary_annotations);
  this->debug = (bool)(other19->debug & 1);
  this->timestamp = other19->timestamp;
  this->duration = other19->duration;
  this->trace_id_high = other19->trace_id_high;
  this->__isset = other19->__isset;
  return;
}

Assistant:

Span::Span(const Span& other19) {
  trace_id = other19.trace_id;
  name = other19.name;
  id = other19.id;
  parent_id = other19.parent_id;
  annotations = other19.annotations;
  binary_annotations = other19.binary_annotations;
  debug = other19.debug;
  timestamp = other19.timestamp;
  duration = other19.duration;
  trace_id_high = other19.trace_id_high;
  __isset = other19.__isset;
}